

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O2

int __thiscall ncnn::LSTM::load_model(LSTM *this,ModelBin *mb)

{
  ulong uVar1;
  uint uVar2;
  Mat local_70;
  
  uVar2 = (this->direction == 2) + 1;
  uVar1 = (long)this->weight_data_size / (long)(int)uVar2;
  uVar1 = (long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) /
          (long)this->num_output;
  (*mb->_vptr_ModelBin[4])
            (&local_70,mb,
             (long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) / 4 & 0xffffffff
             ,(ulong)(uint)(this->num_output << 2),(ulong)uVar2,0);
  Mat::operator=(&this->weight_xc_data,&local_70);
  Mat::~Mat(&local_70);
  if (((this->weight_xc_data).data != (void *)0x0) &&
     ((long)(this->weight_xc_data).c * (this->weight_xc_data).cstep != 0)) {
    (*mb->_vptr_ModelBin[4])(&local_70,mb,(ulong)(uint)this->num_output,4,(ulong)uVar2,0);
    Mat::operator=(&this->bias_c_data,&local_70);
    Mat::~Mat(&local_70);
    if (((this->bias_c_data).data != (void *)0x0) &&
       ((long)(this->bias_c_data).c * (this->bias_c_data).cstep != 0)) {
      (*mb->_vptr_ModelBin[4])
                (&local_70,mb,(ulong)(uint)this->num_output,(ulong)(uint)(this->num_output * 4),
                 (ulong)uVar2,0);
      Mat::operator=(&this->weight_hc_data,&local_70);
      Mat::~Mat(&local_70);
      if (((this->weight_hc_data).data != (void *)0x0) &&
         ((long)(this->weight_hc_data).c * (this->weight_hc_data).cstep != 0)) {
        return 0;
      }
    }
  }
  return -100;
}

Assistant:

int LSTM::load_model(const ModelBin& mb)
{
    int num_directions = direction == 2 ? 2 : 1;

    int size = weight_data_size / num_directions / num_output / 4;

    // raw weight data
    weight_xc_data = mb.load(size, num_output * 4, num_directions, 0);
    if (weight_xc_data.empty())
        return -100;

    bias_c_data = mb.load(num_output, 4, num_directions, 0);
    if (bias_c_data.empty())
        return -100;

    weight_hc_data = mb.load(num_output, num_output * 4, num_directions, 0);
    if (weight_hc_data.empty())
        return -100;

    return 0;
}